

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall slang::ast::TypePrinter::appendMembers(TypePrinter *this,Scope *scope)

{
  format_string<const_std::basic_string_view<char>_&> fmt;
  bool bVar1;
  pointer this_00;
  iterator iVar2;
  Symbol *pSVar3;
  FormatBuffer *this_01;
  char *in_RDI;
  Type *in_stack_00000018;
  TypePrinter *in_stack_00000020;
  VariableSymbol *var;
  Symbol *member;
  iterator __end2;
  iterator __begin2;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *__range2;
  iterator *in_stack_ffffffffffffff68;
  iterator_facade<slang::ast::Scope::iterator,_false> *in_stack_ffffffffffffff70;
  string_view in_stack_ffffffffffffff88;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  local_38;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  *local_28;
  
  this_00 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
            operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *
                       )0xc0a8cd);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_RDI);
  FormatBuffer::append(this_00,in_stack_ffffffffffffff88);
  local_38 = Scope::members((Scope *)this_00);
  local_28 = &local_38;
  std::ranges::
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  ::begin(local_28);
  iVar2 = std::ranges::
          subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
          ::end(local_28);
  while( true ) {
    bVar1 = operator==<slang::ast::Scope::iterator>
                      ((self_type *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    pSVar3 = iterator_facade<slang::ast::Scope::iterator,_false>::operator*
                       ((iterator_facade<slang::ast::Scope::iterator,_false> *)0xc0a95d);
    this_01 = (FormatBuffer *)Symbol::as<slang::ast::VariableSymbol>((Symbol *)0xc0a96c);
    ValueSymbol::getType((ValueSymbol *)0xc0a97b);
    append(in_stack_00000020,in_stack_00000018);
    std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
              ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
               0xc0a996);
    fmt.str.size_ = (size_t)iVar2.current;
    fmt.str.data_ = (char *)pSVar3;
    FormatBuffer::format<std::basic_string_view<char,std::char_traits<char>>const&>
              (this_01,fmt,(basic_string_view<char,_std::char_traits<char>_> *)0x4);
    iterator_facade<slang::ast::Scope::iterator,_false>::operator++<slang::ast::Scope::iterator>
              (in_stack_ffffffffffffff70);
  }
  std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
            ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)0xc0a9e3)
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)this_00,in_RDI);
  FormatBuffer::append(this_00,in_stack_ffffffffffffff88);
  return;
}

Assistant:

void TypePrinter::appendMembers(const Scope& scope) {
    buffer->append("{");
    for (auto& member : scope.members()) {
        auto& var = member.as<VariableSymbol>();
        append(var.getType());
        buffer->format(" {};", var.name);
    }
    buffer->append("}");
}